

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

Aig_Man_t * Aig_ManCreateDualOutputMiter(Aig_Man_t *p1,Aig_Man_t *p2)

{
  uint __line;
  Aig_Man_t *p;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int iVar6;
  char *__assertion;
  
  if (p1->nObjs[2] == p2->nObjs[2]) {
    if (p1->nObjs[3] == p2->nObjs[3]) {
      p = Aig_ManStart(p2->vObjs->nSize + p1->vObjs->nSize);
      p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
      for (iVar6 = 0; iVar6 < p1->vCis->nSize; iVar6 = iVar6 + 1) {
        pvVar1 = Vec_PtrEntry(p1->vCis,iVar6);
        pAVar2 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
      }
      for (iVar6 = 0; iVar6 < p1->vObjs->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,iVar6);
        if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
          pAVar3 = Aig_ObjChild0Copy(pAVar2);
          pAVar4 = Aig_ObjChild1Copy(pAVar2);
          pAVar3 = Aig_And(p,pAVar3,pAVar4);
          (pAVar2->field_5).pData = pAVar3;
        }
      }
      p2->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
      for (iVar6 = 0; iVar6 < p2->vCis->nSize; iVar6 = iVar6 + 1) {
        pvVar1 = Vec_PtrEntry(p2->vCis,iVar6);
        pvVar5 = Vec_PtrEntry(p->vCis,iVar6);
        *(void **)((long)pvVar1 + 0x28) = pvVar5;
      }
      for (iVar6 = 0; iVar6 < p2->vObjs->nSize; iVar6 = iVar6 + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p2->vObjs,iVar6);
        if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
          pAVar3 = Aig_ObjChild0Copy(pAVar2);
          pAVar4 = Aig_ObjChild1Copy(pAVar2);
          pAVar3 = Aig_And(p,pAVar3,pAVar4);
          (pAVar2->field_5).pData = pAVar3;
        }
      }
      for (iVar6 = 0; iVar6 < p1->nObjs[3]; iVar6 = iVar6 + 1) {
        pAVar2 = Aig_ManCo(p1,iVar6);
        pAVar2 = Aig_ObjChild0Copy(pAVar2);
        Aig_ObjCreateCo(p,pAVar2);
        pAVar2 = Aig_ManCo(p2,iVar6);
        pAVar2 = Aig_ObjChild0Copy(pAVar2);
        Aig_ObjCreateCo(p,pAVar2);
      }
      Aig_ManCleanup(p);
      return p;
    }
    __assertion = "Aig_ManCoNum(p1) == Aig_ManCoNum(p2)";
    __line = 0x58;
  }
  else {
    __assertion = "Aig_ManCiNum(p1) == Aig_ManCiNum(p2)";
    __line = 0x57;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress2.c"
                ,__line,"Aig_Man_t *Aig_ManCreateDualOutputMiter(Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Aig_ManCreateDualOutputMiter( Aig_Man_t * p1, Aig_Man_t * p2 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p1) == Aig_ManCiNum(p2) );
    assert( Aig_ManCoNum(p1) == Aig_ManCoNum(p2) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p1) + Aig_ManObjNumMax(p2) );
    // add first AIG
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add second AIG
    Aig_ManConst1(p2)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p2, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    Aig_ManForEachNode( p2, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the outputs
    for ( i = 0; i < Aig_ManCoNum(p1); i++ )
    {
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1, i)) );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(Aig_ManCo(p2, i)) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}